

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void cleartable(GCObject *l)

{
  int iVar1;
  TValue *o_00;
  Node *n_00;
  int iVar2;
  long in_RDI;
  Node *n;
  TValue *o;
  int i;
  Table *h;
  int local_14;
  long local_8;
  
  for (local_8 = in_RDI; local_8 != 0; local_8 = *(long *)(local_8 + 0x30)) {
    local_14 = *(int *)(local_8 + 0x38);
    if ((*(byte *)(local_8 + 9) & 0x10) != 0) {
      while (iVar2 = local_14 + -1, local_14 != 0) {
        o_00 = (TValue *)(*(long *)(local_8 + 0x18) + (long)iVar2 * 0x10);
        iVar1 = iscleared(o_00,0);
        local_14 = iVar2;
        if (iVar1 != 0) {
          o_00->tt = 0;
        }
      }
    }
    local_14 = (int)(1L << (*(byte *)(local_8 + 0xb) & 0x3f));
    while (iVar2 = local_14 + -1, local_14 != 0) {
      n_00 = (Node *)(*(long *)(local_8 + 0x20) + (long)iVar2 * 0x28);
      local_14 = iVar2;
      if (((n_00->i_val).tt != 0) &&
         ((iVar2 = iscleared(&(n_00->i_key).tvk,1), iVar2 != 0 ||
          (iVar2 = iscleared((TValue *)n_00,0), iVar2 != 0)))) {
        (n_00->i_val).tt = 0;
        removeentry(n_00);
      }
    }
  }
  return;
}

Assistant:

static void cleartable(GCObject*l){
while(l){
Table*h=gco2h(l);
int i=h->sizearray;
if(testbit(h->marked,4)){
while(i--){
TValue*o=&h->array[i];
if(iscleared(o,0))
setnilvalue(o);
}
}
i=sizenode(h);
while(i--){
Node*n=gnode(h,i);
if(!ttisnil(gval(n))&&
(iscleared(key2tval(n),1)||iscleared(gval(n),0))){
setnilvalue(gval(n));
removeentry(n);
}
}
l=h->gclist;
}
}